

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fidentity8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  
  auVar1 = vpaddsw_avx2(*in_RDI,*in_RDI);
  *in_RSI = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[1],in_RDI[1]);
  in_RSI[1] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[2],in_RDI[2]);
  in_RSI[2] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[3],in_RDI[3]);
  in_RSI[3] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[4],in_RDI[4]);
  in_RSI[4] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[5],in_RDI[5]);
  in_RSI[5] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[6],in_RDI[6]);
  in_RSI[6] = auVar1;
  auVar1 = vpaddsw_avx2(in_RDI[7],in_RDI[7]);
  in_RSI[7] = auVar1;
  return;
}

Assistant:

static inline void fidentity8x8_new_avx2(const __m256i *input, __m256i *output,
                                         int8_t cos_bit) {
  (void)cos_bit;

  output[0] = _mm256_adds_epi16(input[0], input[0]);
  output[1] = _mm256_adds_epi16(input[1], input[1]);
  output[2] = _mm256_adds_epi16(input[2], input[2]);
  output[3] = _mm256_adds_epi16(input[3], input[3]);
  output[4] = _mm256_adds_epi16(input[4], input[4]);
  output[5] = _mm256_adds_epi16(input[5], input[5]);
  output[6] = _mm256_adds_epi16(input[6], input[6]);
  output[7] = _mm256_adds_epi16(input[7], input[7]);
}